

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

FileOptions *
google::protobuf::Arena::CreateMessageInternal<google::protobuf::FileOptions>(Arena *arena)

{
  FileOptions *this;
  
  if (arena == (Arena *)0x0) {
    this = (FileOptions *)operator_new(0xa8);
    FileOptions::FileOptions(this,(Arena *)0x0,false);
  }
  else {
    this = (FileOptions *)AllocateAlignedWithHook(arena,0xa8,(type_info *)&FileOptions::typeinfo);
    FileOptions::FileOptions(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }